

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void appendChunk(ChunkEntry *ch,UA_ByteString *msg,size_t offset,size_t chunklength)

{
  UA_Byte *pUVar1;
  UA_Byte *new_bytes;
  size_t chunklength_local;
  size_t offset_local;
  UA_ByteString *msg_local;
  ChunkEntry *ch_local;
  
  pUVar1 = (UA_Byte *)realloc((ch->bytes).data,(ch->bytes).length + chunklength);
  if (pUVar1 == (UA_Byte *)0x0) {
    UA_ByteString_deleteMembers(&ch->bytes);
  }
  else {
    (ch->bytes).data = pUVar1;
    memcpy((ch->bytes).data + (ch->bytes).length,msg->data + offset,chunklength);
    (ch->bytes).length = chunklength + (ch->bytes).length;
  }
  return;
}

Assistant:

static void
appendChunk(struct ChunkEntry *ch, const UA_ByteString *msg,
            size_t offset, size_t chunklength) {
    UA_Byte* new_bytes = UA_realloc(ch->bytes.data, ch->bytes.length + chunklength);
    if(!new_bytes) {
        UA_ByteString_deleteMembers(&ch->bytes);
        return;
    }
    ch->bytes.data = new_bytes;
    memcpy(&ch->bytes.data[ch->bytes.length], &msg->data[offset], chunklength);
    ch->bytes.length += chunklength;
}